

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void * ym2612_init(void *param,UINT32 clock,UINT32 rate,FM_TIMERHANDLER timer_handler,
                  FM_IRQHANDLER IRQHandler)

{
  undefined1 auVar1 [16];
  uint uVar2;
  void *pvVar3;
  long lVar4;
  YM2612 *F2612;
  uint uVar5;
  undefined1 auVar6 [16];
  long lVar7;
  
  pvVar3 = calloc(1,0x5120);
  if (pvVar3 != (void *)0x0) {
    init_tables();
    *(void **)((long)pvVar3 + 0x210) = param;
    *(undefined1 *)((long)pvVar3 + 0x208) = 0xe;
    *(long *)((long)pvVar3 + 0x6a0) = (long)pvVar3 + 0x4778;
    *(UINT32 *)((long)pvVar3 + 0x218) = clock;
    *(UINT32 *)((long)pvVar3 + 0x21c) = rate;
    uVar5 = rate - clock / 0x90;
    uVar2 = -uVar5;
    if (0 < (int)uVar5) {
      uVar2 = uVar5;
    }
    *(bool *)((long)pvVar3 + 0x209) = uVar2 < 3;
    *(FM_TIMERHANDLER *)((long)pvVar3 + 0x648) = timer_handler;
    *(FM_IRQHANDLER *)((long)pvVar3 + 0x650) = IRQHandler;
    *(code **)((long)pvVar3 + 0x658) = ssgdummy_set_clock;
    *(code **)((long)pvVar3 + 0x660) = ssgdummy_write;
    *(code **)((long)pvVar3 + 0x668) = ssgdummy_read;
    *(code **)((long)pvVar3 + 0x670) = ssgdummy_reset;
    auVar1 = _DAT_001769f0;
    lVar4 = 0;
    auVar6 = _DAT_001769e0;
    do {
      if (SUB164(auVar6 ^ auVar1,4) == -0x80000000 && SUB164(auVar6 ^ auVar1,0) < -0x7ffffffa) {
        *(undefined1 *)((long)pvVar3 + lVar4 + 0x4908) = 0;
        *(undefined1 *)((long)pvVar3 + lVar4 + 0x4aa0) = 0;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar4 = lVar4 + 0x330;
    } while (lVar4 != 0x990);
    *(undefined1 *)((long)pvVar3 + 0x5110) = 0;
  }
  return pvVar3;
}

Assistant:

void * ym2612_init(void *param, UINT32 clock, UINT32 rate,
				FM_TIMERHANDLER timer_handler,FM_IRQHANDLER IRQHandler)
{
	YM2612 *F2612;

	/* allocate extend state space */
	F2612 = (YM2612 *)calloc(1, sizeof(YM2612));
	if (F2612 == NULL)
		return NULL;

	/* allocate total level table (128kb space) */
	init_tables();

	/* FM */
	F2612->OPN.ST.param = param;
	F2612->OPN.type = TYPE_YM2612;
	F2612->OPN.P_CH = F2612->CH;
	F2612->OPN.ST.clock = clock;
	F2612->OPN.ST.rate = rate;
	OPNCheckNativeSampleRate(&F2612->OPN);
	/* Extend handler */
	F2612->OPN.ST.timer_handler = timer_handler;
	F2612->OPN.ST.IRQ_Handler   = IRQHandler;
	F2612->OPN.LegacyMode = 0x00;
	F2612->WaveOutMode = 0x00;
	OPNLinkSSG(&F2612->OPN, NULL, NULL);
	OPNSetSmplRateChgCallback(&F2612->OPN, NULL, NULL);

	ym2612_set_mute_mask(F2612, 0x00);

	return F2612;
}